

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::GLES2ThreadTest::EGLImage::EGLImage
          (EGLImage *this,SharedPtr<tcu::ThreadUtil::Event> *event,
          SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync> *sync)

{
  SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync> local_40;
  SharedPtr<tcu::ThreadUtil::Event> local_30;
  SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync> *local_20;
  SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync> *sync_local;
  SharedPtr<tcu::ThreadUtil::Event> *event_local;
  EGLImage *this_local;
  
  local_20 = sync;
  sync_local = (SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync> *)event;
  event_local = (SharedPtr<tcu::ThreadUtil::Event> *)this;
  de::SharedPtr<tcu::ThreadUtil::Event>::SharedPtr(&local_30,event);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>::SharedPtr(&local_40,sync);
  Object::Object(&this->super_Object,"EGLImage",&local_30,&local_40);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>::~SharedPtr(&local_40);
  de::SharedPtr<tcu::ThreadUtil::Event>::~SharedPtr(&local_30);
  (this->super_Object).super_Object._vptr_Object = (_func_int **)&PTR__EGLImage_03277ef0;
  this->image = (EGLImageKHR)0x0;
  return;
}

Assistant:

EGLImage::EGLImage (SharedPtr<tcu::ThreadUtil::Event> event, SharedPtr<FenceSync> sync)
	: Object	("EGLImage", event, sync)
	, image		(EGL_NO_IMAGE_KHR)
{
}